

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_452187::cURLProgressHelper::UpdatePercentage
          (cURLProgressHelper *this,double value,double total,string *status)

{
  long lVar1;
  long lVar2;
  long lVar3;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string local_c8;
  cmAlphaNum local_a8;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  size_type local_68;
  pointer local_60;
  undefined8 local_58;
  char *local_50;
  size_t local_48;
  char *pcStack_40;
  undefined8 local_38;
  char *local_30;
  
  lVar1 = this->CurrentPercentage;
  if (0.0 < total) {
    lVar2 = lround((value / total) * 100.0);
    lVar3 = 100;
    if (lVar2 < 100) {
      lVar3 = lVar2;
    }
    this->CurrentPercentage = lVar3;
  }
  lVar3 = this->CurrentPercentage;
  if (lVar1 != lVar3) {
    local_60 = (this->Text)._M_dataplus._M_p;
    local_68 = (this->Text)._M_string_length;
    local_78._M_len = 1;
    local_78._M_str = "[";
    local_58 = 1;
    local_50 = " ";
    cmAlphaNum::cmAlphaNum(&local_a8,lVar3);
    local_48 = local_a8.View_._M_len;
    pcStack_40 = local_a8.View_._M_str;
    local_38 = 0xb;
    local_30 = "% complete]";
    views._M_len = 5;
    views._M_array = &local_78;
    cmCatViews_abi_cxx11_(&local_c8,views);
    std::__cxx11::string::operator=((string *)status,(string *)&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
  return lVar1 != lVar3;
}

Assistant:

bool UpdatePercentage(double value, double total, std::string& status)
  {
    long OldPercentage = this->CurrentPercentage;

    if (total > 0.0) {
      this->CurrentPercentage = std::lround(value / total * 100.0);
      if (this->CurrentPercentage > 100) {
        // Avoid extra progress reports for unexpected data beyond total.
        this->CurrentPercentage = 100;
      }
    }

    bool updated = (OldPercentage != this->CurrentPercentage);

    if (updated) {
      status =
        cmStrCat("[", this->Text, " ", this->CurrentPercentage, "% complete]");
    }

    return updated;
  }